

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O2

Tensor<double> * __thiscall
scp::Tensor<double>::operator=(Tensor<double> *this,Tensor<double> *tensor)

{
  uint64_t uVar1;
  __equal<true> *this_00;
  ulong uVar2;
  bool bVar3;
  uint64_t *puVar4;
  double *pdVar5;
  long lVar6;
  ulong __n;
  int iVar7;
  uint64_t *__src;
  ulong uVar8;
  unsigned_long __n2;
  
  uVar1 = (this->_shape).order;
  if ((uVar1 == (tensor->_shape).order) &&
     ((unsigned_long *)this->_length == (unsigned_long *)tensor->_length)) {
    this_00 = (__equal<true> *)(this->_shape).sizes;
    bVar3 = std::__equal<true>::equal<unsigned_long>
                      (this_00,(unsigned_long *)(this_00 + uVar1 * 8),(tensor->_shape).sizes,
                       (unsigned_long *)this->_length);
    if ((bVar3) || (uVar1 = (this->_shape).order, uVar1 == 0)) goto LAB_001096eb;
    puVar4 = (this->_shape).sizes;
    __src = (tensor->_shape).sizes;
    __n = uVar1 << 3;
  }
  else {
    if (this->_owner == false) {
      __assert_fail("_owner",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Reiex[P]SciPP/include/SciPP/Core/templates/Tensor.hpp"
                    ,0xe3,
                    "Tensor<TValue> &scp::Tensor<double>::operator=(const Tensor<TValue> &) [TValue = double]"
                   );
    }
    puVar4 = (this->_shape).sizes;
    if (puVar4 != (uint64_t *)0x0) {
      operator_delete__(puVar4);
    }
    if (this->_values != (double *)0x0) {
      operator_delete__(this->_values);
    }
    uVar2 = (tensor->_shape).order;
    (this->_shape).order = uVar2;
    __n = uVar2 * 8;
    iVar7 = 1;
    for (lVar6 = 0; __n - lVar6 != 0; lVar6 = lVar6 + 8) {
      iVar7 = iVar7 * *(int *)((long)(tensor->_shape).sizes + lVar6);
    }
    this->_length = (long)iVar7;
    puVar4 = (uint64_t *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | __n);
    (this->_shape).sizes = puVar4;
    uVar8 = 0xffffffffffffffff;
    if (-1 < iVar7) {
      uVar8 = (long)iVar7 << 3;
    }
    pdVar5 = (double *)operator_new__(uVar8);
    this->_values = pdVar5;
    this->_owner = true;
    if (uVar2 == 0) goto LAB_001096eb;
    __src = (tensor->_shape).sizes;
  }
  memmove(puVar4,__src,__n);
LAB_001096eb:
  if (this->_length != 0) {
    memmove(this->_values,tensor->_values,this->_length << 3);
  }
  return this;
}

Assistant:

constexpr Tensor<TValue>& Tensor<TValue>::operator=(const Tensor<TValue>& tensor)
	{
		if (_shape.order != tensor._shape.order || _length != tensor._length)
		{
			assert(_owner);

			delete[] _shape.sizes;
			delete[] _values;

			_shape.order = tensor._shape.order;
			_length = std::accumulate(tensor._shape.sizes, tensor._shape.sizes + tensor._shape.order, 1, std::multiplies<uint64_t>());
			_shape.sizes = new uint64_t[_shape.order];
			_values = new TValue[_length];
			_owner = true;

			std::copy_n(tensor._shape.sizes, _shape.order, _shape.sizes);
		}
		else if (!std::equal(_shape.sizes, _shape.sizes + _shape.order, tensor._shape.sizes))
		{
			std::copy_n(tensor._shape.sizes, _shape.order, _shape.sizes);
		}

		std::copy_n(tensor._values, _length, _values);

		return *this;
	}